

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_earthbind(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  char *txt;
  AFFECT_DATA af;
  
  bVar1 = is_affected((CHAR_DATA *)vo,sn);
  if (!bVar1) {
    bVar1 = is_affected_by((CHAR_DATA *)vo,0x13);
    if (bVar1) {
      bVar1 = saves_spell(level,(CHAR_DATA *)vo,0x10);
      if (!bVar1) {
        init_affect(&af);
        af.where = 0;
        af.aftype = 0;
        af.type = gsn_earthbind;
        af.duration = (short)(level / 5);
        af.location = 0;
        af.modifier = 0;
        af.mod_name = 4;
        af.level = (short)level;
        affect_to_char((CHAR_DATA *)vo,&af);
        send_to_char("Your feet suddenly become heavy and earthbound.\n\r",(CHAR_DATA *)vo);
        act("$n suddenly drops to the ground.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
        return;
      }
      txt = "Spell failed.\n\r";
      goto LAB_0030d43b;
    }
  }
  txt = "Their feet are already on the ground.\n\r";
LAB_0030d43b:
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_earthbind(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	CHAR_DATA *victim = (CHAR_DATA *)vo;

	if (is_affected(victim, sn) || !is_affected_by(victim, AFF_FLYING))
	{
		send_to_char("Their feet are already on the ground.\n\r", ch);
		return;
	}

	if (saves_spell(level, victim, DAM_OTHER))
	{
		send_to_char("Spell failed.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = gsn_earthbind;
	af.modifier = 0;
	af.level = level;
	af.duration = level / 5;
	af.location = 0;
	af.mod_name = MOD_LEVITATION;
	affect_to_char(victim, &af);

	send_to_char("Your feet suddenly become heavy and earthbound.\n\r", victim);
	act("$n suddenly drops to the ground.", victim, 0, 0, TO_ROOM);
}